

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_clone(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int min_level;
  char *pcVar2;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar3;
  OBJ_DATA *pOVar4;
  CHAR_DATA *clone;
  char arg [4608];
  char buf [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  pcVar2 = one_argument(argument,local_2428);
  if (local_2428[0] == '\0') {
    pcVar2 = "Clone what?\n\r";
    goto LAB_002724bb;
  }
  bVar1 = str_prefix(local_2428,"object");
  if (bVar1) {
    bVar1 = str_prefix(local_2428,"mobile");
    if ((bVar1) && (bVar1 = str_prefix(local_2428,"character"), bVar1)) {
      ch_00 = get_char_room(ch,argument);
      pOVar3 = get_obj_here(ch,argument);
      if (ch_00 != (CHAR_DATA *)0x0 || pOVar3 != (OBJ_DATA *)0x0) {
LAB_002722b2:
        if (pOVar3 == (OBJ_DATA *)0x0) {
          if (ch_00 == (CHAR_DATA *)0x0) {
            return;
          }
          bVar1 = is_npc(ch_00);
          if (!bVar1) {
            pcVar2 = "You can only clone mobiles.\n\r";
            goto LAB_002724bb;
          }
          if ((((((ch_00->level < 0x15) || (bVar1 = is_trusted(ch,0x38), bVar1)) &&
                ((ch_00->level < 0xb || (bVar1 = is_trusted(ch,0x37), bVar1)))) &&
               ((ch_00->level < 6 || (bVar1 = is_trusted(ch,0x36), bVar1)))) &&
              ((ch_00->level < 1 || (bVar1 = is_trusted(ch,0x35), bVar1)))) &&
             (bVar1 = is_trusted(ch,0x34), bVar1)) {
            clone = create_mobile(ch_00->pIndexData);
            clone_mobile(ch_00,clone);
            for (pOVar3 = ch_00->carrying; pOVar3 != (OBJ_DATA *)0x0; pOVar3 = pOVar3->next_content)
            {
              bVar1 = obj_check(ch,pOVar3);
              if (bVar1) {
                pOVar4 = create_object(pOVar3->pIndexData,0);
                clone_object(pOVar3,pOVar4);
                recursive_clone(ch,pOVar3,pOVar4);
                obj_to_char(pOVar4,clone);
                pOVar4->wear_loc = pOVar3->wear_loc;
              }
            }
            char_to_room(clone,ch->in_room);
            act("$n has created $N.",ch,(void *)0x0,clone,0);
            act("You clone $N.",ch,(void *)0x0,clone,3);
            pcVar2 = local_1228;
            sprintf(pcVar2,"$N clones %s.",clone->short_descr);
            min_level = get_trust(ch);
            pOVar4 = (OBJ_DATA *)0x0;
            goto LAB_002724aa;
          }
        }
        else {
          bVar1 = obj_check(ch,pOVar3);
          if (bVar1) {
            pOVar4 = create_object(pOVar3->pIndexData,0);
            clone_object(pOVar3,pOVar4);
            if (pOVar3->carried_by == (CHAR_DATA *)0x0) {
              obj_to_room(pOVar4,ch->in_room);
            }
            else {
              obj_to_char(pOVar4,ch);
            }
            recursive_clone(ch,pOVar3,pOVar4);
            act("$n has created $p.",ch,pOVar4,(void *)0x0,0);
            act("You clone $p.",ch,pOVar4,(void *)0x0,3);
            min_level = get_trust(ch);
            pcVar2 = "$N clones $p.";
LAB_002724aa:
            wiznet(pcVar2,ch,pOVar4,0x10,0xc,min_level);
            return;
          }
        }
        pcVar2 = "Your powers are not great enough for such a task.\n\r";
        goto LAB_002724bb;
      }
    }
    else {
      ch_00 = get_char_room(ch,pcVar2);
      if (ch_00 != (CHAR_DATA *)0x0) {
        pOVar3 = (OBJ_DATA *)0x0;
        goto LAB_002722b2;
      }
    }
  }
  else {
    pOVar3 = get_obj_here(ch,pcVar2);
    if (pOVar3 != (OBJ_DATA *)0x0) {
      ch_00 = (CHAR_DATA *)0x0;
      goto LAB_002722b2;
    }
  }
  pcVar2 = "You don\'t see that here.\n\r";
LAB_002724bb:
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_clone(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *rest;
	CHAR_DATA *mob;
	OBJ_DATA *obj;

	rest = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Clone what?\n\r", ch);
		return;
	}

	if (!str_prefix(arg, "object"))
	{
		mob = nullptr;
		obj = get_obj_here(ch, rest);

		if (obj == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg, "mobile") || !str_prefix(arg, "character"))
	{
		obj = nullptr;
		mob = get_char_room(ch, rest);

		if (mob == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}
	else /* find both */
	{
		mob = get_char_room(ch, argument);
		obj = get_obj_here(ch, argument);
		if (mob == nullptr && obj == nullptr)
		{
			send_to_char("You don't see that here.\n\r", ch);
			return;
		}
	}

	/* clone an object */
	if (obj != nullptr)
	{
		OBJ_DATA *clone;

		if (!obj_check(ch, obj))
		{
			send_to_char("Your powers are not great enough for such a task.\n\r", ch);
			return;
		}

		clone = create_object(obj->pIndexData, 0);
		clone_object(obj, clone);

		if (obj->carried_by != nullptr)
			obj_to_char(clone, ch);
		else
			obj_to_room(clone, ch->in_room);

		recursive_clone(ch, obj, clone);

		act("$n has created $p.", ch, clone, nullptr, TO_ROOM);
		act("You clone $p.", ch, clone, nullptr, TO_CHAR);

		wiznet("$N clones $p.", ch, clone, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	}
	else if (mob != nullptr)
	{
		CHAR_DATA *clone;
		OBJ_DATA *new_obj;
		char buf[MAX_STRING_LENGTH];

		if (!is_npc(mob))
		{
			send_to_char("You can only clone mobiles.\n\r", ch);
			return;
		}

		if ((mob->level > 20 && !is_trusted(ch, GOD))
			|| (mob->level > 10 && !is_trusted(ch, IMMORTAL))
			|| (mob->level > 5 && !is_trusted(ch, DEMI))
			|| (mob->level > 0 && !is_trusted(ch, ANGEL))
			|| !is_trusted(ch, AVATAR))
		{
			send_to_char("Your powers are not great enough for such a task.\n\r", ch);
			return;
		}

		clone = create_mobile(mob->pIndexData);
		clone_mobile(mob, clone);

		for (obj = mob->carrying; obj != nullptr; obj = obj->next_content)
		{
			if (obj_check(ch, obj))
			{
				new_obj = create_object(obj->pIndexData, 0);
				clone_object(obj, new_obj);
				recursive_clone(ch, obj, new_obj);
				obj_to_char(new_obj, clone);
				new_obj->wear_loc = obj->wear_loc;
			}
		}

		char_to_room(clone, ch->in_room);

		act("$n has created $N.", ch, nullptr, clone, TO_ROOM);
		act("You clone $N.", ch, nullptr, clone, TO_CHAR);

		sprintf(buf, "$N clones %s.", clone->short_descr);
		wiznet(buf, ch, nullptr, WIZ_LOAD, WIZ_SECURE, get_trust(ch));
	}
}